

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O1

bool output_buffer(DESCRIPTOR_DATA *d)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  short sVar4;
  bool bVar5;
  bool flash;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  size_t sVar10;
  char *__s;
  char *pcVar11;
  char *pcVar12;
  char buf2 [128];
  char buf [4608];
  int local_12d4;
  int local_12bc;
  undefined4 local_12b8;
  char local_1238 [4616];
  
  if (d == (DESCRIPTOR_DATA *)0x0) {
    return false;
  }
  __s = local_1238;
  memset(__s,0,0x1200);
  if (*d->outbuf == '\0') {
    bVar7 = true;
  }
  else {
    bVar7 = true;
    local_12bc = 7;
    bVar9 = false;
    local_12d4 = 7;
    bVar5 = false;
    bVar8 = false;
    bVar6 = false;
    flash = false;
    __s = local_1238;
    pcVar11 = d->outbuf;
    do {
      pcVar12 = pcVar11 + 2;
      while( true ) {
        if ((long)d->outtop <= (long)pcVar11 - (long)d->outbuf) goto LAB_0027eee9;
        if (0x11df < (int)__s - (int)local_1238) {
          *__s = '\0';
          sVar4 = d->descriptor;
          sVar10 = strlen(local_1238);
          bVar7 = write_to_descriptor((int)sVar4,local_1238,(int)sVar10);
          if (!bVar7) {
            __s = __s + 1;
            goto LAB_0027eee9;
          }
          memset(local_1238,0,0x1200);
          __s = local_1238;
        }
        if (pcVar12[-2] == '{') break;
        *__s = pcVar12[-2];
        __s = __s + 1;
        pcVar11 = pcVar11 + 1;
        bVar9 = false;
        pcVar1 = pcVar12 + -1;
        pcVar12 = pcVar12 + 1;
        if (*pcVar1 == '\0') goto LAB_0027eee9;
      }
      if ((!bVar9) && (pcVar12[-1] != '<')) {
        local_12bc = local_12d4;
        bVar5 = bVar8;
        bVar6 = flash;
      }
      bVar2 = pcVar12[-1];
      bVar9 = true;
      if (0x61 < bVar2) {
        if (0x6d < bVar2) {
          if (bVar2 == 0x6e) {
            if ((d->character == (CHAR_DATA *)0x0) || (bVar8 = is_ansi(d->character), !bVar8)) {
              local_12b8 = local_12b8 & 0xffffff00;
            }
            else {
              local_12b8 = 0x6d5b1b;
            }
            local_12d4 = 7;
            flash = false;
            bVar8 = false;
          }
          else {
            if (bVar2 != 0x78) goto switchD_0027ecf2_caseD_2e;
            local_12b8 = CONCAT22(local_12b8._2_2_,0x7b);
          }
          goto LAB_0027ee50;
        }
        if (bVar2 == 0x62) {
          bVar8 = false;
        }
        else {
          if (bVar2 != 0x66) goto switchD_0027ecf2_caseD_2e;
          flash = false;
        }
        goto LAB_0027ee53;
      }
      switch(bVar2) {
      case 0x2d:
        local_12b8 = CONCAT22(local_12b8._2_2_,0x7e);
LAB_0027ee50:
        bVar9 = false;
        break;
      default:
switchD_0027ecf2_caseD_2e:
        bVar9 = false;
        sprintf((char *)&local_12b8,"{%c",(ulong)(uint)(int)(char)bVar2);
        break;
      case 0x30:
        local_12d4 = 0;
        break;
      case 0x31:
        local_12d4 = 1;
        break;
      case 0x32:
        local_12d4 = 2;
        break;
      case 0x33:
        local_12d4 = 3;
        break;
      case 0x34:
        local_12d4 = 4;
        break;
      case 0x35:
        local_12d4 = 5;
        break;
      case 0x36:
        local_12d4 = 6;
        break;
      case 0x37:
        local_12d4 = 7;
        break;
      case 0x3c:
        local_12d4 = local_12bc;
        bVar8 = bVar5;
        flash = bVar6;
        break;
      case 0x42:
        bVar8 = true;
        goto LAB_0027ed9e;
      case 0x46:
        flash = true;
LAB_0027ed9e:
        bVar9 = true;
      }
LAB_0027ee53:
      if (bVar9) {
        if ((d->character == (CHAR_DATA *)0x0) || (bVar9 = is_ansi(d->character), !bVar9)) {
          local_12b8 = local_12b8 & 0xffffff00;
        }
        else {
          pcVar11 = color_value_string(local_12d4,bVar8,flash);
          strcpy((char *)&local_12b8,pcVar11);
        }
      }
      *__s = (char)local_12b8;
      if ((char)local_12b8 != '\0') {
        pcVar11 = (char *)((long)&local_12b8 + 1);
        do {
          cVar3 = *pcVar11;
          __s[1] = cVar3;
          __s = __s + 1;
          pcVar11 = pcVar11 + 1;
        } while (cVar3 != '\0');
      }
      bVar9 = true;
      pcVar11 = pcVar12;
    } while (*pcVar12 != '\0');
  }
LAB_0027eee9:
  *__s = '\0';
  if (bVar7 == false) {
    bVar7 = false;
  }
  else {
    sVar4 = d->descriptor;
    sVar10 = strlen(local_1238);
    bVar7 = write_to_descriptor((int)sVar4,local_1238,(int)sVar10);
  }
  d->outtop = 0;
  return bVar7;
}

Assistant:

bool output_buffer(DESCRIPTOR_DATA *d)
{
	char buf[MAX_STRING_LENGTH];
	char buf2[128];
	const char *str;
	char *i;
	char *point;
	bool flash= false, o_flash, bold= false, o_bold;
	bool act= false, ok = true, color_code= false;
	int color = 7, o_color;

	/* discard nullptr descriptor */
	if (d == nullptr)
		return false;

	memset(buf, '\0', MAX_STRING_LENGTH);
	point = buf;
	str = d->outbuf;
	o_color = color;
	o_bold = bold;
	o_flash = flash;

	while (*str != '\0' && (str - d->outbuf) < d->outtop)
	{
		if ((int)(point - buf) >= MAX_STRING_LENGTH - 32)
		{
			/* buffer is full, so send it through the socket */
			*point++ = '\0';

			if (!(ok = write_to_descriptor(d->descriptor, buf, strlen(buf))))
				break;

			memset(buf, '\0', MAX_STRING_LENGTH);
			point = buf;
		}

		if (*str != '{')
		{
			color_code= false;
			*point++ = *str++;
			continue;
		}

		if (!color_code && *(str + 1) != '<')
		{
			o_color = color;
			o_bold = bold;
			o_flash = flash;
		}

		color_code = true;
		act= false;
		str++;

		switch (*str)
		{
			case 'x':
				sprintf(buf2, "{");
				break;
			case '-':
				sprintf(buf2, "~");
				break;
			case '<':
				color = o_color;
				bold = o_bold;
				flash = o_flash;
				act = true;
				break;
			case '0':
				color = 0;
				act = true;
				break;
			case '1':
				color = 1;
				act = true;
				break;
			case '2':
				color = 2;
				act = true;
				break;
			case '3':
				color = 3;
				act = true;
				break;
			case '4':
				color = 4;
				act = true;
				break;
			case '5':
				color = 5;
				act = true;
				break;
			case '6':
				color = 6;
				act = true;
				break;
			case '7':
				color = 7;
				act = true;
				break;
			case 'B':
				bold = true;
				act = true;
				break;
			case 'b':
				bold= false;
				act = true;
				break;
			case 'F':
				flash = true;
				act = true;
				break;
			case 'f':
				flash= false;
				act = true;
				break;
			case 'n':
				if (d->character && is_ansi(d->character))
					sprintf(buf2, "%s", ANSI_NORMAL);
				else
					buf2[0] = '\0';

				bold= false;
				color = 7;
				flash= false;
				break;
			default:
				sprintf(buf2, "{%c", *str);
				break;
		}

		if (act)
		{
			if (d->character && is_ansi(d->character))
			{
				sprintf(buf2, "%s", color_value_string(color, bold, flash));
				color_code = true;
			}
			else
			{
				buf2[0] = '\0';
			}
		}

		i = buf2;
		str++;
		while ((*point = *i) != '\0')
		{
			++point, ++i;
		}
	}

	*point++ = '\0';
	ok = ok && (write_to_descriptor(d->descriptor, buf, strlen(buf)));
	d->outtop = 0;

	return ok;
}